

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int pull_unknown_key_value(uchar **cursor,size_t *max,uchar *pre_key,wally_map *unknowns)

{
  int iVar1;
  size_t len;
  uchar *key;
  size_t len_00;
  uchar *value;
  
  if (*cursor != (uchar *)0x0) {
    *max = (size_t)(*cursor + (*max - (long)pre_key));
    *cursor = pre_key;
    len = pull_varlength(cursor,max);
    key = pull_skip(cursor,max,len);
    len_00 = pull_varlength(cursor,max);
    value = pull_skip(cursor,max,len_00);
    iVar1 = map_add(unknowns,key,len,value,len_00,false,(_func_int_uchar_ptr_size_t *)0x0,false);
    return iVar1;
  }
  return -2;
}

Assistant:

static int pull_unknown_key_value(const unsigned char **cursor, size_t *max,
                                  const unsigned char *pre_key,
                                  struct wally_map *unknowns)
{
    const unsigned char *key, *val;
    size_t key_len, val_len;

    /* If we've already failed, it's invalid */
    if (!*cursor)
        return WALLY_EINVAL;

    /* We have to unwind a bit, to get entire key again. */
    *max += (*cursor - pre_key);
    *cursor = pre_key;

    key_len = pull_varlength(cursor, max);
    key = pull_skip(cursor, max, key_len);
    val_len = pull_varlength(cursor, max);
    val = pull_skip(cursor, max, val_len);

    return map_add(unknowns, key, key_len, val, val_len, false, NULL, false);
}